

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int height;
  bool bVar5;
  int iVar6;
  GLFWmonitor **ppGVar7;
  GLFWvidmode *pGVar8;
  GLFWvidmode *pGVar9;
  char *pcVar10;
  GLFWmonitor *pGVar11;
  GLFWmonitor *pGVar12;
  GLFWwindow *handle;
  bool bVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int count_1;
  int count_2;
  int count;
  float xscale;
  int height_mm;
  int width_mm;
  int y;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78 [2];
  int local_70;
  float local_6c;
  float local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  GLFWmonitor **local_58;
  long local_50;
  GLFWvidmode *local_48;
  GLFWmonitor *local_40;
  GLFWvidmode *local_38;
  
  bVar5 = true;
  do {
    bVar13 = bVar5;
    iVar6 = getopt(argc,argv,"th");
    bVar5 = false;
  } while (iVar6 == 0x74);
  if (iVar6 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar6 = glfwInit();
    if (iVar6 == 0) goto LAB_00113fc3;
    ppGVar7 = glfwGetMonitors(&local_70);
    if (0 < local_70) {
      lVar14 = 0;
      local_58 = ppGVar7;
      do {
        pGVar12 = local_58[lVar14];
        local_50 = lVar14;
        if (bVar13) {
          pGVar8 = glfwGetVideoMode(pGVar12);
          pGVar9 = glfwGetVideoModes(pGVar12,(int *)&local_88);
          glfwGetMonitorPos(pGVar12,(int *)&local_8c,(int *)&local_5c);
          glfwGetMonitorPhysicalSize(pGVar12,(int *)&local_60,(int *)&local_64);
          glfwGetMonitorContentScale(pGVar12,&local_68,&local_6c);
          pcVar10 = glfwGetMonitorName(pGVar12);
          pGVar11 = glfwGetPrimaryMonitor();
          pcVar15 = "secondary";
          if (pGVar11 == pGVar12) {
            pcVar15 = "primary";
          }
          printf("Name: %s (%s)\n",pcVar10,pcVar15);
          format_mode(pGVar8);
          printf("Current mode: %s\n",format_mode::buffer);
          printf("Virtual position: %i %i\n",(ulong)local_8c,(ulong)local_5c);
          printf("Content scale: %f %f\n",(double)local_68,(double)local_6c);
          printf("Physical size: %i x %i mm (%0.2f dpi)\n",
                 (double)(((float)pGVar8->width * 25.4) / (float)(int)local_60),(ulong)local_60,
                 (ulong)local_64);
          puts("Modes:");
          if (0 < (int)local_88) {
            uVar16 = 0;
            do {
              format_mode(pGVar9);
              printf("%3u: %s",uVar16 & 0xffffffff,format_mode::buffer);
              auVar18[0] = -((char)pGVar9->width == (char)pGVar8->width);
              auVar18[1] = -(*(char *)((long)&pGVar9->width + 1) ==
                            *(char *)((long)&pGVar8->width + 1));
              auVar18[2] = -(*(char *)((long)&pGVar9->width + 2) ==
                            *(char *)((long)&pGVar8->width + 2));
              auVar18[3] = -(*(char *)((long)&pGVar9->width + 3) ==
                            *(char *)((long)&pGVar8->width + 3));
              auVar18[4] = -((char)pGVar9->height == (char)pGVar8->height);
              auVar18[5] = -(*(char *)((long)&pGVar9->height + 1) ==
                            *(char *)((long)&pGVar8->height + 1));
              auVar18[6] = -(*(char *)((long)&pGVar9->height + 2) ==
                            *(char *)((long)&pGVar8->height + 2));
              auVar18[7] = -(*(char *)((long)&pGVar9->height + 3) ==
                            *(char *)((long)&pGVar8->height + 3));
              auVar18[8] = -((char)pGVar9->redBits == (char)pGVar8->redBits);
              auVar18[9] = -(*(char *)((long)&pGVar9->redBits + 1) ==
                            *(char *)((long)&pGVar8->redBits + 1));
              auVar18[10] = -(*(char *)((long)&pGVar9->redBits + 2) ==
                             *(char *)((long)&pGVar8->redBits + 2));
              auVar18[0xb] = -(*(char *)((long)&pGVar9->redBits + 3) ==
                              *(char *)((long)&pGVar8->redBits + 3));
              auVar18[0xc] = -((char)pGVar9->greenBits == (char)pGVar8->greenBits);
              auVar18[0xd] = -(*(char *)((long)&pGVar9->greenBits + 1) ==
                              *(char *)((long)&pGVar8->greenBits + 1));
              auVar18[0xe] = -(*(char *)((long)&pGVar9->greenBits + 2) ==
                              *(char *)((long)&pGVar8->greenBits + 2));
              auVar18[0xf] = -(*(char *)((long)&pGVar9->greenBits + 3) ==
                              *(char *)((long)&pGVar8->greenBits + 3));
              uVar1 = pGVar8->blueBits;
              uVar3 = pGVar8->refreshRate;
              uVar2 = pGVar9->blueBits;
              uVar4 = pGVar9->refreshRate;
              auVar19[0] = -((char)uVar2 == (char)uVar1);
              auVar19[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
              auVar19[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
              auVar19[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
              auVar19[4] = -((char)uVar4 == (char)uVar3);
              auVar19[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
              auVar19[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
              auVar19[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
              auVar19[8] = 0xff;
              auVar19[9] = 0xff;
              auVar19[10] = 0xff;
              auVar19[0xb] = 0xff;
              auVar19[0xc] = 0xff;
              auVar19[0xd] = 0xff;
              auVar19[0xe] = 0xff;
              auVar19[0xf] = 0xff;
              auVar19 = auVar19 & auVar18;
              if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
                printf(" (current mode)");
              }
              putchar(10);
              uVar16 = uVar16 + 1;
              pGVar9 = pGVar9 + 1;
            } while ((long)uVar16 < (long)(int)local_88);
          }
        }
        else {
          local_38 = glfwGetVideoModes(pGVar12,(int *)&local_8c);
          if (0 < (int)local_8c) {
            uVar16 = 0;
            local_40 = pGVar12;
            do {
              pGVar9 = local_38;
              pGVar12 = local_40;
              pGVar8 = local_38 + uVar16;
              glfwWindowHint(0x21001,local_38[uVar16].redBits);
              glfwWindowHint(0x21002,pGVar9[uVar16].greenBits);
              glfwWindowHint(0x21003,pGVar9[uVar16].blueBits);
              glfwWindowHint(0x2100f,pGVar9[uVar16].refreshRate);
              pcVar10 = glfwGetMonitorName(pGVar12);
              local_48 = pGVar8;
              format_mode(pGVar8);
              printf("Testing mode %u on monitor %s: %s\n",uVar16 & 0xffffffff,pcVar10,
                     format_mode::buffer);
              iVar6 = pGVar9[uVar16].width;
              height = pGVar9[uVar16].height;
              pGVar12 = glfwGetPrimaryMonitor();
              handle = glfwCreateWindow(iVar6,height,"Video Mode Test",pGVar12,(GLFWwindow *)0x0);
              pGVar8 = local_48;
              if (handle == (GLFWwindow *)0x0) {
                format_mode(local_48);
                printf("Failed to enter mode %u: %s\n",uVar16 & 0xffffffff,format_mode::buffer);
              }
              else {
                glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
                glfwSetKeyCallback(handle,key_callback);
                glfwMakeContextCurrent(handle);
                gladLoadGLLoader(glfwGetProcAddress);
                glfwSwapInterval(1);
                glfwSetTime(0.0);
                while (dVar17 = glfwGetTime(), dVar17 < 5.0) {
                  (*glad_glClear)(0x4000);
                  glfwSwapBuffers(handle);
                  glfwPollEvents();
                  iVar6 = glfwWindowShouldClose(handle);
                  if (iVar6 != 0) {
                    puts("User terminated program");
                    goto LAB_00113fd9;
                  }
                }
                (*glad_glGetIntegerv)(0xd52,(GLint *)&local_80);
                (*glad_glGetIntegerv)(0xd53,(GLint *)&local_7c);
                (*glad_glGetIntegerv)(0xd54,(GLint *)local_78);
                glfwGetWindowSize(handle,(int *)&local_88,(int *)&local_84);
                if (((local_80 != pGVar8->redBits) || (local_7c != pGVar8->greenBits)) ||
                   (local_78[0] != pGVar8->blueBits)) {
                  printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",
                         (ulong)local_80,(ulong)local_7c,(ulong)local_78[0],
                         (ulong)(uint)pGVar8->redBits,(ulong)(uint)pGVar8->greenBits,
                         pGVar8->blueBits);
                }
                if ((local_88 != pGVar8->width) || (local_84 != pGVar8->height)) {
                  printf("*** Size mismatch: %ix%i instead of %ix%i\n",(ulong)local_88,
                         (ulong)local_84);
                }
                puts("Closing window");
                glfwDestroyWindow(handle);
                glfwPollEvents();
              }
              uVar16 = uVar16 + 1;
            } while ((long)uVar16 < (long)(int)local_8c);
          }
        }
        lVar14 = local_50 + 1;
      } while (lVar14 < local_70);
    }
LAB_00113fd9:
    glfwTerminate();
  }
  else {
    if (iVar6 != 0x68) {
      usage();
LAB_00113fc3:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, count, mode = LIST_MODE;
    GLFWmonitor** monitors;

    while ((ch = getopt(argc, argv, "th")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 't':
                mode = TEST_MODE;
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitors = glfwGetMonitors(&count);

    for (i = 0;  i < count;  i++)
    {
        if (mode == LIST_MODE)
            list_modes(monitors[i]);
        else if (mode == TEST_MODE)
            test_modes(monitors[i]);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}